

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

void fxp_free_names(fxp_names *names)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < names->nnames; lVar2 = lVar2 + 1) {
    safefree(*(void **)((long)&names->names->filename + lVar1));
    safefree(*(void **)((long)&names->names->longname + lVar1));
    lVar1 = lVar1 + 0x48;
  }
  safefree(names->names);
  safefree(names);
  return;
}

Assistant:

void fxp_free_names(struct fxp_names *names)
{
    int i;

    for (i = 0; i < names->nnames; i++) {
        sfree(names->names[i].filename);
        sfree(names->names[i].longname);
    }
    sfree(names->names);
    sfree(names);
}